

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall pbrt::RealisticCamera::TestExitPupilBounds(RealisticCamera *this)

{
  float fVar1;
  size_t sVar2;
  Bounds2<float> *pBVar3;
  float sx;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  Float FVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM5 [64];
  undefined4 in_XMM6_Da;
  undefined4 in_XMM6_Db;
  undefined8 in_XMM6_Qb;
  Ray testOut;
  float local_e8;
  float local_d8;
  float local_a8;
  float local_98;
  undefined1 local_80 [32];
  MediumHandle local_60;
  Ray local_58;
  
  auVar29 = in_ZMM5._0_16_;
  auVar21 = in_ZMM0._0_16_;
  fVar1 = *(float *)(((this->super_CameraBase).film.
                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff) +
                    0x20);
  if (TestExitPupilBounds()::rng == '\0') {
    TestExitPupilBounds();
  }
  uVar9 = _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 * 0x5851f42d4c957f2d +
          0xda3e39cb94b95bdb;
  if (_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_1 == '\0') {
    uVar9 = _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 * 0x5851f42d4c957f2d;
  }
  uVar8 = (uint)(_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 >> 0x2d) ^
          (uint)(_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 >> 0x1b);
  bVar10 = (byte)(_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 >> 0x3b);
  sVar2 = (this->exitPupilBounds).nStored;
  auVar21 = vcvtusi2ss_avx512f(auVar21,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
  pBVar3 = (this->exitPupilBounds).ptr;
  auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  iVar13 = (int)sVar2;
  iVar12 = iVar13 + -1;
  sx = fVar1 * auVar21._0_4_ * 0.5;
  auVar21 = vcvtusi2ss_avx512f(auVar29,sVar2 - 1);
  auVar21 = ZEXT416((uint)((sx / (fVar1 * 0.5)) * auVar21._0_4_));
  auVar21 = vroundss_avx(auVar21,auVar21,9);
  iVar14 = (int)auVar21._0_4_;
  if (iVar12 < (int)auVar21._0_4_) {
    iVar14 = iVar12;
  }
  iVar12 = iVar14 + 1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = pBVar3[iVar14].pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = pBVar3[iVar14].pMax.super_Tuple2<pbrt::Point2,_float>;
  if (iVar12 < iVar13) {
    auVar22._8_8_ = 0;
    auVar22._0_8_ = pBVar3[iVar12].pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = pBVar3[iVar12].pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar29 = vminps_avx(auVar22,auVar29);
    auVar21 = vmaxps_avx(auVar27,auVar21);
  }
  auVar22 = vmovshdup_avx(auVar29);
  auVar27 = vmovshdup_avx(auVar21);
  iVar13 = 1000;
  _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 = uVar9;
  do {
    lVar11 = 0;
    if (_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_1 != '\0') {
      lVar11 = -0x25c1c6346b46a425;
    }
    uVar9 = _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 * 0x5851f42d4c957f2d + lVar11;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar9;
    auVar24 = vpunpcklqdq_avx(auVar23,auVar28);
    auVar17 = vpsrlvq_avx2(auVar24,_DAT_003ea520);
    auVar18 = vpsrlvq_avx2(auVar24,_DAT_003ea530);
    auVar24 = vpsrlq_avx(auVar24,0x3b);
    auVar24 = vpshufd_avx(auVar24,0xe8);
    _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 = uVar9 * 0x5851f42d4c957f2d + lVar11;
    auVar17 = vpshufd_avx(auVar17 ^ auVar18,0xe8);
    auVar24 = vprorvd_avx512vl(auVar17,auVar24);
    auVar17 = vcvtudq2ps_avx512vl(auVar24);
    auVar24._8_4_ = 0x2f800000;
    auVar24._0_8_ = 0x2f8000002f800000;
    auVar24._12_4_ = 0x2f800000;
    auVar24 = vmulps_avx512vl(auVar17,auVar24);
    auVar17._8_4_ = 0x3f7fffff;
    auVar17._0_8_ = 0x3f7fffff3f7fffff;
    auVar17._12_4_ = 0x3f7fffff;
    auVar24 = vminps_avx512vl(auVar24,auVar17);
    auVar25._0_4_ = auVar24._0_4_ + auVar24._0_4_;
    auVar25._4_4_ = auVar24._4_4_ + auVar24._4_4_;
    auVar25._8_4_ = auVar24._8_4_ + auVar24._8_4_;
    auVar25._12_4_ = auVar24._12_4_ + auVar24._12_4_;
    auVar18._8_4_ = 0xbf800000;
    auVar18._0_8_ = 0xbf800000bf800000;
    auVar18._12_4_ = 0xbf800000;
    auVar17 = vaddps_avx512vl(auVar25,auVar18);
    fVar19 = auVar17._0_4_;
    auVar24 = vmovshdup_avx(auVar17);
    fVar16 = auVar24._0_4_;
    if (fVar19 == 0.0) {
      auVar24 = (undefined1  [16])0x0;
      if ((fVar16 != 0.0) || (NAN(fVar16))) goto LAB_003b5014;
    }
    else {
LAB_003b5014:
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl(auVar17,auVar4);
      auVar26._0_4_ = fVar19 / fVar16;
      auVar26._4_12_ = auVar17._4_12_;
      auVar24 = vshufps_avx(auVar18,auVar18,0xf5);
      auVar17 = vfmadd132ss_fma(auVar26,SUB6416(ZEXT464(0x3fc90fdb),0),ZEXT416(0xbf490fdb));
      bVar7 = auVar24._0_4_ < auVar18._0_4_;
      fVar15 = (float)((uint)bVar7 * (int)((fVar16 / fVar19) * 0.7853982) +
                      (uint)!bVar7 * auVar17._0_4_);
      fVar16 = (float)((uint)bVar7 * (int)fVar19 + (uint)!bVar7 * (int)fVar16);
      fVar19 = cosf(fVar15);
      fVar15 = sinf(fVar15);
      auVar24 = vinsertps_avx(ZEXT416((uint)(fVar16 * fVar19)),ZEXT416((uint)(fVar16 * fVar15)),0x10
                             );
    }
    fVar16 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].apertureRadius;
    local_58.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    fVar19 = auVar24._0_4_ * fVar16;
    auVar24 = vmovshdup_avx(auVar24);
    fVar16 = auVar24._0_4_ * fVar16;
    local_80._0_8_ = vmovlps_avx(ZEXT416((uint)sx));
    local_80._8_4_ = 0.0;
    local_80._12_16_ = vinsertps_avx(ZEXT416((uint)(fVar19 - sx)),ZEXT416((uint)fVar16),0x1c);
    local_58._16_12_ = SUB1612(ZEXT816(0),0);
    local_58.o.super_Tuple3<pbrt::Point3,_float> =
         (Tuple3<pbrt::Point3,_float>)((undefined1  [12])local_58._16_12_ << 0x20);
    local_60.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    local_58.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    FVar20 = TraceLensesFromFilm(this,(Ray *)local_80,&local_58);
    local_98 = auVar21._0_4_;
    local_a8 = auVar29._0_4_;
    if ((FVar20 != 0.0) || (NAN(FVar20))) {
      local_d8 = auVar22._0_4_;
      local_e8 = auVar27._0_4_;
      if ((fVar19 < local_a8) ||
         (((local_98 < fVar19 || (fVar16 < local_d8)) || (local_e8 < fVar16)))) {
        fprintf(_stderr,"Aha! (%f,%f) went through, but outside bounds (%f,%f) - (%f,%f)\n",
                (double)fVar19,(double)fVar16,(double)local_a8,(double)local_d8,(double)local_98,
                (double)local_e8);
        auVar5._4_4_ = in_XMM6_Db;
        auVar5._0_4_ = in_XMM6_Da;
        auVar5._8_8_ = in_XMM6_Qb;
        auVar21 = vcvtusi2ss_avx512f(auVar5,(this->exitPupilBounds).nStored);
        RenderExitPupil(this,((float)iVar14 / auVar21._0_4_) * fVar1 * 0.5,0.0,"low.exr");
        auVar6._4_4_ = in_XMM6_Db;
        auVar6._0_4_ = in_XMM6_Da;
        auVar6._8_8_ = in_XMM6_Qb;
        auVar21 = vcvtusi2ss_avx512f(auVar6,(this->exitPupilBounds).nStored);
        RenderExitPupil(this,((float)iVar12 / auVar21._0_4_) * fVar1 * 0.5,0.0,"high.exr");
        RenderExitPupil(this,sx,0.0,"mid.exr");
        exit(0);
      }
    }
    iVar13 = iVar13 + -1;
    if (iVar13 == 0) {
      fputc(0x2e,_stderr);
      return;
    }
  } while( true );
}

Assistant:

void RealisticCamera::TestExitPupilBounds() const {
    Float filmDiagonal = film.Diagonal();

    static RNG rng;

    Float u = rng.Uniform<Float>();
    Point3f pFilm(u * filmDiagonal / 2, 0, 0);

    Float r = pFilm.x / (filmDiagonal / 2);
    int pupilIndex = std::min<int>(exitPupilBounds.size() - 1,
                                   std::floor(r * (exitPupilBounds.size() - 1)));
    Bounds2f pupilBounds = exitPupilBounds[pupilIndex];
    if (pupilIndex + 1 < (int)exitPupilBounds.size())
        pupilBounds = Union(pupilBounds, exitPupilBounds[pupilIndex + 1]);

    // Now, randomly pick points on the aperture and see if any are outside
    // of pupil bounds...
    for (int i = 0; i < 1000; ++i) {
        Point2f u2{rng.Uniform<Float>(), rng.Uniform<Float>()};
        Point2f pd = SampleUniformDiskConcentric(u2);
        pd *= RearElementRadius();

        Ray testRay(pFilm, Point3f(pd.x, pd.y, 0.f) - pFilm);
        Ray testOut;
        if (!TraceLensesFromFilm(testRay, &testOut))
            continue;

        if (!Inside(pd, pupilBounds)) {
            fprintf(stderr,
                    "Aha! (%f,%f) went through, but outside bounds (%f,%f) - "
                    "(%f,%f)\n",
                    pd.x, pd.y, pupilBounds.pMin[0], pupilBounds.pMin[1],
                    pupilBounds.pMax[0], pupilBounds.pMax[1]);
            RenderExitPupil(
                (Float)pupilIndex / exitPupilBounds.size() * filmDiagonal / 2.f, 0.f,
                "low.exr");
            RenderExitPupil(
                (Float)(pupilIndex + 1) / exitPupilBounds.size() * filmDiagonal / 2.f,
                0.f, "high.exr");
            RenderExitPupil(pFilm.x, 0.f, "mid.exr");
            exit(0);
        }
    }
    fprintf(stderr, ".");
}